

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *this)

{
  TermList TVar1;
  ulong uVar2;
  Lib local_b8 [16];
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_a8;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_88;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_68;
  PolyNf local_34;
  AnyPoly local_1c;
  
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&local_a8,&this->_factors);
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
            (&local_68,(MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_a8);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_88,&local_68);
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
            (local_b8,(Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_88);
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[4] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[5] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[6] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_1_ = 1;
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0] = (char)local_b8[0];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[1] = (char)local_b8[1];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[2] = (char)local_b8[2];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[3] = (char)local_b8[3];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_3_ = SUB83(local_b8._8_8_,0);
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._11_5_ = SUB85(local_b8._8_8_,3);
  PolyNf::PolyNf(&local_34,&local_1c);
  TVar1 = PolyNf::denormalize(&local_34);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_88);
  mpz_clear(local_68.numeral._den._val);
  mpz_clear((__mpz_struct *)&local_68);
  if (local_a8._stack != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar2 = local_a8._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)
       &((local_a8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
    }
    else {
      operator_delete(local_a8._stack,0x10);
    }
  }
  return (TermList)TVar1._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize()  const
{
  return PolyNf(AnyPoly(perfect(Polynom(Monom(MonomFactors(*this)))))).denormalize(); 
}